

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding.cpp
# Opt level: O3

void ncnn::copy_make_border_image<float>(Mat *src,Mat *dst,int top,int left,int type,float v)

{
  uint uVar1;
  int iVar2;
  undefined4 uVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  undefined4 *puVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  undefined4 *puVar17;
  long lVar18;
  ulong uVar19;
  void *pvVar20;
  uint uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int iVar29;
  int iVar36;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int iVar38;
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  long local_a8;
  
  auVar37 = _DAT_001727d0;
  auVar51 = _DAT_00172270;
  auVar50 = _DAT_00172260;
  auVar49 = _DAT_00172100;
  uVar19 = (ulong)(uint)left;
  uVar1 = dst->w;
  lVar6 = (long)(int)uVar1;
  iVar2 = dst->h;
  puVar17 = (undefined4 *)src->data;
  pvVar20 = dst->data;
  if (type == 0) {
    if (top < 1) {
      iVar16 = 0;
    }
    else {
      lVar14 = (ulong)uVar1 - 1;
      auVar52._8_4_ = (int)lVar14;
      auVar52._0_8_ = lVar14;
      auVar52._12_4_ = (int)((ulong)lVar14 >> 0x20);
      iVar15 = 0;
      auVar52 = auVar52 ^ _DAT_00172100;
      do {
        if (0 < (int)uVar1) {
          lVar14 = 0;
          auVar40 = auVar51;
          auVar44 = auVar50;
          do {
            auVar48 = auVar40 ^ auVar49;
            iVar16 = auVar52._4_4_;
            if ((bool)(~(auVar48._4_4_ == iVar16 && auVar52._0_4_ < auVar48._0_4_ ||
                        iVar16 < auVar48._4_4_) & 1)) {
              *(float *)((long)pvVar20 + lVar14) = v;
            }
            if ((auVar48._12_4_ != auVar52._12_4_ || auVar48._8_4_ <= auVar52._8_4_) &&
                auVar48._12_4_ <= auVar52._12_4_) {
              *(float *)((long)pvVar20 + lVar14 + 4) = v;
            }
            auVar48 = auVar44 ^ auVar49;
            iVar29 = auVar48._4_4_;
            if (iVar29 <= iVar16 && (iVar29 != iVar16 || auVar48._0_4_ <= auVar52._0_4_)) {
              *(float *)((long)pvVar20 + lVar14 + 8) = v;
              *(float *)((long)pvVar20 + lVar14 + 0xc) = v;
            }
            lVar7 = auVar37._0_8_;
            lVar12 = auVar40._8_8_;
            auVar40._0_8_ = auVar40._0_8_ + lVar7;
            lVar8 = auVar37._8_8_;
            auVar40._8_8_ = lVar12 + lVar8;
            lVar12 = auVar44._8_8_;
            auVar44._0_8_ = auVar44._0_8_ + lVar7;
            auVar44._8_8_ = lVar12 + lVar8;
            lVar14 = lVar14 + 0x10;
          } while ((ulong)(uVar1 + 3 >> 2) << 4 != lVar14);
        }
        pvVar20 = (void *)((long)pvVar20 + lVar6 * 4);
        iVar15 = iVar15 + 1;
        iVar16 = top;
      } while (iVar15 != top);
    }
    if (iVar16 < src->h + top) {
      lVar14 = uVar19 - 1;
      auVar37._8_4_ = (int)lVar14;
      auVar37._0_8_ = lVar14;
      auVar37._12_4_ = (int)((ulong)lVar14 >> 0x20);
      local_a8 = (long)pvVar20 + 0xc;
      auVar37 = auVar37 ^ _DAT_00172100;
      auVar49 = _DAT_00172260;
      auVar50 = _DAT_00172270;
      auVar51 = _DAT_00172100;
      do {
        uVar9 = 0;
        if (0 < left) {
          lVar14 = 0;
          auVar48 = auVar49;
          auVar39 = auVar50;
          do {
            auVar52 = auVar39 ^ auVar51;
            iVar15 = auVar37._4_4_;
            if ((bool)(~(auVar52._4_4_ == iVar15 && auVar37._0_4_ < auVar52._0_4_ ||
                        iVar15 < auVar52._4_4_) & 1)) {
              *(float *)((long)pvVar20 + lVar14) = v;
            }
            if ((auVar52._12_4_ != auVar37._12_4_ || auVar52._8_4_ <= auVar37._8_4_) &&
                auVar52._12_4_ <= auVar37._12_4_) {
              *(float *)((long)pvVar20 + lVar14 + 4) = v;
            }
            iVar29 = SUB164(auVar48 ^ auVar51,4);
            if (iVar29 <= iVar15 &&
                (iVar29 != iVar15 || SUB164(auVar48 ^ auVar51,0) <= auVar37._0_4_)) {
              *(float *)((long)pvVar20 + lVar14 + 8) = v;
              *(float *)((long)pvVar20 + lVar14 + 0xc) = v;
            }
            lVar7 = auVar39._8_8_;
            auVar39._0_8_ = auVar39._0_8_ + 4;
            auVar39._8_8_ = lVar7 + 4;
            lVar7 = auVar48._8_8_;
            auVar48._0_8_ = auVar48._0_8_ + 4;
            auVar48._8_8_ = lVar7 + 4;
            lVar14 = lVar14 + 0x10;
            uVar9 = uVar19;
          } while ((ulong)(left + 3U >> 2) << 4 != lVar14);
        }
        iVar15 = src->w;
        uVar21 = (uint)uVar9;
        if ((long)iVar15 < 0xc) {
          uVar5 = iVar15 + left;
          if ((int)uVar21 < (int)uVar5) {
            do {
              *(undefined4 *)((long)pvVar20 + uVar9 * 4) = puVar17[uVar9 - (long)left];
              uVar9 = uVar9 + 1;
              uVar21 = uVar5;
            } while (uVar5 != uVar9);
          }
        }
        else {
          memcpy((void *)((long)pvVar20 + (long)left * 4),puVar17,(long)iVar15 << 2);
          iVar15 = src->w;
          auVar49 = _DAT_00172260;
          auVar50 = _DAT_00172270;
          auVar51 = _DAT_00172100;
          uVar21 = uVar21 + iVar15;
        }
        if ((int)uVar21 < (int)uVar1) {
          lVar7 = lVar6 - (int)uVar21;
          lVar14 = lVar7 + -1;
          auVar41._8_4_ = (int)lVar14;
          auVar41._0_8_ = lVar14;
          auVar41._12_4_ = (int)((ulong)lVar14 >> 0x20);
          lVar14 = local_a8 + (long)(int)uVar21 * 4;
          uVar9 = 0;
          do {
            auVar24._8_4_ = (int)uVar9;
            auVar24._0_8_ = uVar9;
            auVar24._12_4_ = (int)(uVar9 >> 0x20);
            auVar52 = (auVar24 | auVar50) ^ auVar51;
            iVar29 = SUB164(auVar41 ^ auVar51,0);
            bVar4 = iVar29 < auVar52._0_4_;
            iVar36 = SUB164(auVar41 ^ auVar51,4);
            iVar38 = auVar52._4_4_;
            if ((iVar36 < iVar38 || iVar38 == iVar36 && bVar4) != true) {
              *(float *)(lVar14 + -0xc + uVar9 * 4) = v;
            }
            if (iVar36 >= iVar38 && (iVar38 != iVar36 || !bVar4)) {
              *(float *)(lVar14 + -8 + uVar9 * 4) = v;
            }
            auVar52 = (auVar24 | auVar49) ^ auVar51;
            iVar38 = auVar52._4_4_;
            if (iVar38 <= iVar36 && (iVar38 != iVar36 || auVar52._0_4_ <= iVar29)) {
              *(float *)(lVar14 + -4 + uVar9 * 4) = v;
              *(float *)(lVar14 + uVar9 * 4) = v;
            }
            uVar9 = uVar9 + 4;
          } while ((lVar7 + 3U & 0xfffffffffffffffc) != uVar9);
        }
        puVar17 = puVar17 + iVar15;
        pvVar20 = (void *)((long)pvVar20 + lVar6 * 4);
        iVar16 = iVar16 + 1;
        local_a8 = local_a8 + lVar6 * 4;
      } while (iVar16 < src->h + top);
    }
    auVar51 = _DAT_00172270;
    auVar50 = _DAT_00172260;
    auVar49 = _DAT_00172100;
    if (iVar16 < iVar2) {
      lVar14 = (ulong)uVar1 - 1;
      auVar53._8_4_ = (int)lVar14;
      auVar53._0_8_ = lVar14;
      auVar53._12_4_ = (int)((ulong)lVar14 >> 0x20);
      auVar53 = auVar53 ^ _DAT_00172100;
      do {
        if (0 < (int)uVar1) {
          lVar14 = 0;
          auVar42 = auVar51;
          auVar45 = auVar50;
          do {
            auVar37 = auVar42 ^ auVar49;
            iVar15 = auVar53._4_4_;
            if ((bool)(~(auVar37._4_4_ == iVar15 && auVar53._0_4_ < auVar37._0_4_ ||
                        iVar15 < auVar37._4_4_) & 1)) {
              *(float *)((long)pvVar20 + lVar14) = v;
            }
            if ((auVar37._12_4_ != auVar53._12_4_ || auVar37._8_4_ <= auVar53._8_4_) &&
                auVar37._12_4_ <= auVar53._12_4_) {
              *(float *)((long)pvVar20 + lVar14 + 4) = v;
            }
            auVar37 = auVar45 ^ auVar49;
            iVar29 = auVar37._4_4_;
            if (iVar29 <= iVar15 && (iVar29 != iVar15 || auVar37._0_4_ <= auVar53._0_4_)) {
              *(float *)((long)pvVar20 + lVar14 + 8) = v;
              *(float *)((long)pvVar20 + lVar14 + 0xc) = v;
            }
            lVar7 = auVar42._8_8_;
            auVar42._0_8_ = auVar42._0_8_ + 4;
            auVar42._8_8_ = lVar7 + 4;
            lVar7 = auVar45._8_8_;
            auVar45._0_8_ = auVar45._0_8_ + 4;
            auVar45._8_8_ = lVar7 + 4;
            lVar14 = lVar14 + 0x10;
          } while ((ulong)(uVar1 + 3 >> 2) << 4 != lVar14);
        }
        iVar16 = iVar16 + 1;
        pvVar20 = (void *)((long)pvVar20 + lVar6 * 4);
      } while (iVar16 != iVar2);
    }
  }
  else if (type == 2) {
    uVar9 = (ulong)(uint)src->w;
    puVar17 = puVar17 + src->w * top;
    if (top < 1) {
      iVar16 = 0;
    }
    else {
      lVar14 = (long)left;
      iVar15 = 0;
      do {
        uVar11 = 0;
        if (0 < left) {
          puVar10 = puVar17 + lVar14;
          uVar13 = 0;
          do {
            *(undefined4 *)((long)pvVar20 + uVar13 * 4) = *puVar10;
            uVar13 = uVar13 + 1;
            puVar10 = puVar10 + -1;
            uVar11 = uVar19;
          } while (uVar19 != uVar13);
        }
        uVar21 = (uint)uVar11;
        if ((int)uVar9 < 0xc) {
          uVar5 = (int)uVar9 + left;
          if ((int)uVar21 < (int)uVar5) {
            do {
              *(undefined4 *)((long)pvVar20 + uVar11 * 4) = puVar17[uVar11 - lVar14];
              uVar11 = uVar11 + 1;
              uVar21 = uVar5;
            } while (uVar5 != uVar11);
          }
        }
        else {
          memcpy((void *)((long)pvVar20 + lVar14 * 4),puVar17,uVar9 << 2);
          uVar9 = (ulong)(uint)src->w;
          uVar21 = uVar21 + src->w;
        }
        if ((int)uVar21 < (int)uVar1) {
          lVar7 = (long)(int)uVar21;
          iVar16 = (left + -2 + (int)uVar9 * 2) - uVar21;
          do {
            *(undefined4 *)((long)pvVar20 + lVar7 * 4) = puVar17[iVar16];
            lVar7 = lVar7 + 1;
            iVar16 = iVar16 + -1;
          } while (lVar6 != lVar7);
        }
        pvVar20 = (void *)((long)pvVar20 + lVar6 * 4);
        puVar17 = puVar17 + -(long)(int)uVar9;
        iVar15 = iVar15 + 1;
        iVar16 = top;
      } while (iVar15 != top);
    }
    if (iVar16 < src->h + top) {
      lVar14 = (long)left;
      do {
        uVar11 = 0;
        if (0 < left) {
          puVar10 = puVar17 + lVar14;
          uVar13 = 0;
          do {
            *(undefined4 *)((long)pvVar20 + uVar13 * 4) = *puVar10;
            uVar13 = uVar13 + 1;
            puVar10 = puVar10 + -1;
            uVar11 = uVar19;
          } while (uVar19 != uVar13);
        }
        uVar21 = (uint)uVar11;
        if ((int)uVar9 < 0xc) {
          uVar5 = (int)uVar9 + left;
          if ((int)uVar21 < (int)uVar5) {
            do {
              *(undefined4 *)((long)pvVar20 + uVar11 * 4) = puVar17[uVar11 - lVar14];
              uVar11 = uVar11 + 1;
              uVar21 = uVar5;
            } while (uVar5 != uVar11);
          }
        }
        else {
          memcpy((void *)((long)pvVar20 + lVar14 * 4),puVar17,uVar9 << 2);
          uVar9 = (ulong)(uint)src->w;
          uVar21 = uVar21 + src->w;
        }
        if ((int)uVar21 < (int)uVar1) {
          lVar7 = (long)(int)uVar21;
          iVar15 = (left + -2 + (int)uVar9 * 2) - uVar21;
          do {
            *(undefined4 *)((long)pvVar20 + lVar7 * 4) = puVar17[iVar15];
            lVar7 = lVar7 + 1;
            iVar15 = iVar15 + -1;
          } while (lVar6 != lVar7);
        }
        puVar17 = puVar17 + (int)uVar9;
        pvVar20 = (void *)((long)pvVar20 + lVar6 * 4);
        iVar16 = iVar16 + 1;
      } while (iVar16 < src->h + top);
    }
    if (iVar16 < iVar2) {
      puVar17 = puVar17 + -(long)((int)uVar9 * 2);
      lVar14 = (long)left;
      do {
        uVar11 = 0;
        if (0 < left) {
          puVar10 = puVar17 + lVar14;
          uVar13 = 0;
          do {
            *(undefined4 *)((long)pvVar20 + uVar13 * 4) = *puVar10;
            uVar13 = uVar13 + 1;
            puVar10 = puVar10 + -1;
            uVar11 = uVar19;
          } while (uVar19 != uVar13);
        }
        uVar21 = (uint)uVar11;
        if ((int)uVar9 < 0xc) {
          uVar5 = (int)uVar9 + left;
          if ((int)uVar21 < (int)uVar5) {
            do {
              *(undefined4 *)((long)pvVar20 + uVar11 * 4) = puVar17[uVar11 - lVar14];
              uVar11 = uVar11 + 1;
              uVar21 = uVar5;
            } while (uVar5 != uVar11);
          }
        }
        else {
          memcpy((void *)((long)pvVar20 + lVar14 * 4),puVar17,uVar9 << 2);
          uVar9 = (ulong)(uint)src->w;
          uVar21 = uVar21 + src->w;
        }
        if ((int)uVar21 < (int)uVar1) {
          lVar7 = (long)(int)uVar21;
          iVar15 = (left + -2 + (int)uVar9 * 2) - uVar21;
          do {
            *(undefined4 *)((long)pvVar20 + lVar7 * 4) = puVar17[iVar15];
            lVar7 = lVar7 + 1;
            iVar15 = iVar15 + -1;
          } while (lVar6 != lVar7);
        }
        pvVar20 = (void *)((long)pvVar20 + lVar6 * 4);
        puVar17 = puVar17 + -(long)(int)uVar9;
        iVar16 = iVar16 + 1;
      } while (iVar16 != iVar2);
    }
  }
  else if (type == 1) {
    lVar14 = (long)left;
    if (top < 1) {
      iVar16 = 0;
    }
    else {
      lVar7 = uVar19 - 1;
      auVar43._8_4_ = (int)lVar7;
      auVar43._0_8_ = lVar7;
      auVar43._12_4_ = (int)((ulong)lVar7 >> 0x20);
      lVar7 = (long)pvVar20 + 0xc;
      iVar15 = 0;
      auVar43 = auVar43 ^ _DAT_00172100;
      auVar49 = _DAT_00172260;
      auVar50 = _DAT_00172270;
      auVar51 = _DAT_00172100;
      do {
        uVar9 = 0;
        if (0 < left) {
          uVar3 = *puVar17;
          lVar8 = 0;
          auVar22 = auVar50;
          auVar30 = auVar49;
          do {
            auVar37 = auVar22 ^ auVar51;
            iVar16 = auVar43._4_4_;
            if ((bool)(~(auVar37._4_4_ == iVar16 && auVar43._0_4_ < auVar37._0_4_ ||
                        iVar16 < auVar37._4_4_) & 1)) {
              *(undefined4 *)((long)pvVar20 + lVar8) = uVar3;
            }
            if ((auVar37._12_4_ != auVar43._12_4_ || auVar37._8_4_ <= auVar43._8_4_) &&
                auVar37._12_4_ <= auVar43._12_4_) {
              *(undefined4 *)((long)pvVar20 + lVar8 + 4) = uVar3;
            }
            iVar29 = SUB164(auVar30 ^ auVar51,4);
            if (iVar29 <= iVar16 &&
                (iVar29 != iVar16 || SUB164(auVar30 ^ auVar51,0) <= auVar43._0_4_)) {
              *(undefined4 *)((long)pvVar20 + lVar8 + 8) = uVar3;
              *(undefined4 *)((long)pvVar20 + lVar8 + 0xc) = uVar3;
            }
            lVar12 = auVar22._8_8_;
            auVar22._0_8_ = auVar22._0_8_ + 4;
            auVar22._8_8_ = lVar12 + 4;
            lVar12 = auVar30._8_8_;
            auVar30._0_8_ = auVar30._0_8_ + 4;
            auVar30._8_8_ = lVar12 + 4;
            lVar8 = lVar8 + 0x10;
            uVar9 = uVar19;
          } while ((ulong)(left + 3U >> 2) << 4 != lVar8);
        }
        iVar16 = src->w;
        uVar21 = (uint)uVar9;
        if ((long)iVar16 < 0xc) {
          uVar5 = iVar16 + left;
          if ((int)uVar21 < (int)uVar5) {
            do {
              *(undefined4 *)((long)pvVar20 + uVar9 * 4) = puVar17[uVar9 - lVar14];
              uVar9 = uVar9 + 1;
              uVar21 = uVar5;
            } while (uVar5 != uVar9);
          }
        }
        else {
          memcpy((void *)((long)pvVar20 + lVar14 * 4),puVar17,(long)iVar16 << 2);
          iVar16 = src->w;
          auVar49 = _DAT_00172260;
          auVar50 = _DAT_00172270;
          auVar51 = _DAT_00172100;
          uVar21 = uVar21 + iVar16;
        }
        if ((int)uVar21 < (int)uVar1) {
          uVar3 = puVar17[(long)iVar16 + -1];
          lVar12 = lVar6 - (int)uVar21;
          lVar8 = lVar12 + -1;
          auVar23._8_4_ = (int)lVar8;
          auVar23._0_8_ = lVar8;
          auVar23._12_4_ = (int)((ulong)lVar8 >> 0x20);
          lVar8 = lVar7 + (long)(int)uVar21 * 4;
          uVar9 = 0;
          do {
            auVar31._8_4_ = (int)uVar9;
            auVar31._0_8_ = uVar9;
            auVar31._12_4_ = (int)(uVar9 >> 0x20);
            auVar37 = (auVar31 | auVar50) ^ auVar51;
            iVar16 = SUB164(auVar23 ^ auVar51,0);
            bVar4 = iVar16 < auVar37._0_4_;
            iVar29 = SUB164(auVar23 ^ auVar51,4);
            iVar36 = auVar37._4_4_;
            if ((iVar29 < iVar36 || iVar36 == iVar29 && bVar4) != true) {
              *(undefined4 *)(lVar8 + -0xc + uVar9 * 4) = uVar3;
            }
            if (iVar29 >= iVar36 && (iVar36 != iVar29 || !bVar4)) {
              *(undefined4 *)(lVar8 + -8 + uVar9 * 4) = uVar3;
            }
            auVar37 = (auVar31 | auVar49) ^ auVar51;
            iVar36 = auVar37._4_4_;
            if (iVar36 <= iVar29 && (iVar36 != iVar29 || auVar37._0_4_ <= iVar16)) {
              *(undefined4 *)(lVar8 + -4 + uVar9 * 4) = uVar3;
              *(undefined4 *)(lVar8 + uVar9 * 4) = uVar3;
            }
            uVar9 = uVar9 + 4;
          } while ((lVar12 + 3U & 0xfffffffffffffffc) != uVar9);
        }
        pvVar20 = (void *)((long)pvVar20 + lVar6 * 4);
        iVar15 = iVar15 + 1;
        lVar7 = lVar7 + lVar6 * 4;
        iVar16 = top;
      } while (iVar15 != top);
    }
    if (iVar16 < src->h + top) {
      lVar7 = uVar19 - 1;
      auVar46._8_4_ = (int)lVar7;
      auVar46._0_8_ = lVar7;
      auVar46._12_4_ = (int)((ulong)lVar7 >> 0x20);
      local_a8 = (long)pvVar20 + 0xc;
      auVar46 = auVar46 ^ _DAT_00172100;
      auVar49 = _DAT_00172260;
      auVar50 = _DAT_00172270;
      auVar51 = _DAT_00172100;
      do {
        uVar11 = 0;
        if (0 < left) {
          uVar3 = *puVar17;
          lVar7 = 0;
          auVar25 = auVar50;
          auVar32 = auVar49;
          do {
            auVar37 = auVar25 ^ auVar51;
            iVar15 = auVar46._4_4_;
            if ((bool)(~(auVar37._4_4_ == iVar15 && auVar46._0_4_ < auVar37._0_4_ ||
                        iVar15 < auVar37._4_4_) & 1)) {
              *(undefined4 *)((long)pvVar20 + lVar7) = uVar3;
            }
            if ((auVar37._12_4_ != auVar46._12_4_ || auVar37._8_4_ <= auVar46._8_4_) &&
                auVar37._12_4_ <= auVar46._12_4_) {
              *(undefined4 *)((long)pvVar20 + lVar7 + 4) = uVar3;
            }
            iVar29 = SUB164(auVar32 ^ auVar51,4);
            if (iVar29 <= iVar15 &&
                (iVar29 != iVar15 || SUB164(auVar32 ^ auVar51,0) <= auVar46._0_4_)) {
              *(undefined4 *)((long)pvVar20 + lVar7 + 8) = uVar3;
              *(undefined4 *)((long)pvVar20 + lVar7 + 0xc) = uVar3;
            }
            lVar8 = auVar25._8_8_;
            auVar25._0_8_ = auVar25._0_8_ + 4;
            auVar25._8_8_ = lVar8 + 4;
            lVar8 = auVar32._8_8_;
            auVar32._0_8_ = auVar32._0_8_ + 4;
            auVar32._8_8_ = lVar8 + 4;
            lVar7 = lVar7 + 0x10;
            uVar11 = uVar19;
          } while ((ulong)(left + 3U >> 2) << 4 != lVar7);
        }
        uVar9 = (ulong)src->w;
        uVar21 = (uint)uVar11;
        if ((long)uVar9 < 0xc) {
          uVar5 = src->w + left;
          if ((int)uVar21 < (int)uVar5) {
            do {
              *(undefined4 *)((long)pvVar20 + uVar11 * 4) = puVar17[uVar11 - lVar14];
              uVar11 = uVar11 + 1;
              uVar21 = uVar5;
            } while (uVar5 != uVar11);
          }
        }
        else {
          memcpy((void *)((long)pvVar20 + lVar14 * 4),puVar17,uVar9 << 2);
          uVar9 = (ulong)(uint)src->w;
          auVar49 = _DAT_00172260;
          auVar50 = _DAT_00172270;
          auVar51 = _DAT_00172100;
          uVar21 = uVar21 + src->w;
        }
        if ((int)uVar21 < (int)uVar1) {
          uVar3 = puVar17[(long)(int)uVar9 + -1];
          lVar8 = lVar6 - (int)uVar21;
          lVar7 = lVar8 + -1;
          auVar26._8_4_ = (int)lVar7;
          auVar26._0_8_ = lVar7;
          auVar26._12_4_ = (int)((ulong)lVar7 >> 0x20);
          lVar7 = local_a8 + (long)(int)uVar21 * 4;
          uVar11 = 0;
          do {
            auVar33._8_4_ = (int)uVar11;
            auVar33._0_8_ = uVar11;
            auVar33._12_4_ = (int)(uVar11 >> 0x20);
            auVar37 = (auVar33 | auVar50) ^ auVar51;
            iVar15 = SUB164(auVar26 ^ auVar51,0);
            bVar4 = iVar15 < auVar37._0_4_;
            iVar29 = SUB164(auVar26 ^ auVar51,4);
            iVar36 = auVar37._4_4_;
            if ((iVar29 < iVar36 || iVar36 == iVar29 && bVar4) != true) {
              *(undefined4 *)(lVar7 + -0xc + uVar11 * 4) = uVar3;
            }
            if (iVar29 >= iVar36 && (iVar36 != iVar29 || !bVar4)) {
              *(undefined4 *)(lVar7 + -8 + uVar11 * 4) = uVar3;
            }
            auVar37 = (auVar33 | auVar49) ^ auVar51;
            iVar36 = auVar37._4_4_;
            if (iVar36 <= iVar29 && (iVar36 != iVar29 || auVar37._0_4_ <= iVar15)) {
              *(undefined4 *)(lVar7 + -4 + uVar11 * 4) = uVar3;
              *(undefined4 *)(lVar7 + uVar11 * 4) = uVar3;
            }
            uVar11 = uVar11 + 4;
          } while ((lVar8 + 3U & 0xfffffffffffffffc) != uVar11);
        }
        lVar7 = (long)(int)uVar9;
        puVar17 = puVar17 + lVar7;
        pvVar20 = (void *)((long)pvVar20 + lVar6 * 4);
        iVar16 = iVar16 + 1;
        local_a8 = local_a8 + lVar6 * 4;
      } while (iVar16 < src->h + top);
    }
    else {
      uVar9 = (ulong)(uint)src->w;
      lVar7 = (long)src->w;
    }
    if (iVar16 < iVar2) {
      puVar10 = puVar17 + -lVar7;
      lVar8 = uVar19 - 1;
      auVar47._8_4_ = (int)lVar8;
      auVar47._0_8_ = lVar8;
      auVar47._12_4_ = (int)((ulong)lVar8 >> 0x20);
      lVar8 = (long)pvVar20 + 0xc;
      auVar47 = auVar47 ^ _DAT_00172100;
      auVar49 = _DAT_00172260;
      auVar50 = _DAT_00172270;
      auVar51 = _DAT_00172100;
      do {
        uVar11 = 0;
        if (0 < left) {
          uVar3 = *puVar10;
          lVar12 = 0;
          auVar27 = auVar50;
          auVar34 = auVar49;
          do {
            auVar37 = auVar27 ^ auVar51;
            iVar15 = auVar47._4_4_;
            if ((bool)(~(auVar37._4_4_ == iVar15 && auVar47._0_4_ < auVar37._0_4_ ||
                        iVar15 < auVar37._4_4_) & 1)) {
              *(undefined4 *)((long)pvVar20 + lVar12) = uVar3;
            }
            if ((auVar37._12_4_ != auVar47._12_4_ || auVar37._8_4_ <= auVar47._8_4_) &&
                auVar37._12_4_ <= auVar47._12_4_) {
              *(undefined4 *)((long)pvVar20 + lVar12 + 4) = uVar3;
            }
            iVar29 = SUB164(auVar34 ^ auVar51,4);
            if (iVar29 <= iVar15 &&
                (iVar29 != iVar15 || SUB164(auVar34 ^ auVar51,0) <= auVar47._0_4_)) {
              *(undefined4 *)((long)pvVar20 + lVar12 + 8) = uVar3;
              *(undefined4 *)((long)pvVar20 + lVar12 + 0xc) = uVar3;
            }
            lVar18 = auVar27._8_8_;
            auVar27._0_8_ = auVar27._0_8_ + 4;
            auVar27._8_8_ = lVar18 + 4;
            lVar18 = auVar34._8_8_;
            auVar34._0_8_ = auVar34._0_8_ + 4;
            auVar34._8_8_ = lVar18 + 4;
            lVar12 = lVar12 + 0x10;
            uVar11 = uVar19;
          } while ((ulong)(left + 3U >> 2) << 4 != lVar12);
        }
        uVar21 = (uint)uVar11;
        if ((int)uVar9 < 0xc) {
          uVar5 = (int)uVar9 + left;
          if ((int)uVar21 < (int)uVar5) {
            do {
              *(undefined4 *)((long)pvVar20 + uVar11 * 4) =
                   *(undefined4 *)((long)puVar17 + (uVar11 * 4 - (lVar14 * 4 + lVar7 * 4)));
              uVar11 = uVar11 + 1;
              uVar21 = uVar5;
            } while (uVar5 != uVar11);
          }
        }
        else {
          memcpy((void *)((long)pvVar20 + lVar14 * 4),puVar10,(uVar9 & 0xffffffff) << 2);
          uVar9 = (ulong)(uint)src->w;
          auVar49 = _DAT_00172260;
          auVar50 = _DAT_00172270;
          auVar51 = _DAT_00172100;
          uVar21 = uVar21 + src->w;
        }
        if ((int)uVar21 < (int)uVar1) {
          uVar3 = puVar10[(long)(int)uVar9 + -1];
          lVar18 = lVar6 - (int)uVar21;
          lVar12 = lVar18 + -1;
          auVar28._8_4_ = (int)lVar12;
          auVar28._0_8_ = lVar12;
          auVar28._12_4_ = (int)((ulong)lVar12 >> 0x20);
          lVar12 = lVar8 + (long)(int)uVar21 * 4;
          uVar11 = 0;
          do {
            auVar35._8_4_ = (int)uVar11;
            auVar35._0_8_ = uVar11;
            auVar35._12_4_ = (int)(uVar11 >> 0x20);
            auVar37 = (auVar35 | auVar50) ^ auVar51;
            iVar15 = SUB164(auVar28 ^ auVar51,0);
            bVar4 = iVar15 < auVar37._0_4_;
            iVar29 = SUB164(auVar28 ^ auVar51,4);
            iVar36 = auVar37._4_4_;
            if ((iVar29 < iVar36 || iVar36 == iVar29 && bVar4) != true) {
              *(undefined4 *)(lVar12 + -0xc + uVar11 * 4) = uVar3;
            }
            if (iVar29 >= iVar36 && (iVar36 != iVar29 || !bVar4)) {
              *(undefined4 *)(lVar12 + -8 + uVar11 * 4) = uVar3;
            }
            auVar37 = (auVar35 | auVar49) ^ auVar51;
            iVar36 = auVar37._4_4_;
            if (iVar36 <= iVar29 && (iVar36 != iVar29 || auVar37._0_4_ <= iVar15)) {
              *(undefined4 *)(lVar12 + -4 + uVar11 * 4) = uVar3;
              *(undefined4 *)(lVar12 + uVar11 * 4) = uVar3;
            }
            uVar11 = uVar11 + 4;
          } while ((lVar18 + 3U & 0xfffffffffffffffc) != uVar11);
        }
        pvVar20 = (void *)((long)pvVar20 + lVar6 * 4);
        iVar16 = iVar16 + 1;
        lVar8 = lVar8 + lVar6 * 4;
      } while (iVar16 != iVar2);
    }
  }
  return;
}

Assistant:

static void copy_make_border_image(const Mat& src, Mat& dst, int top, int left, int type, T v)
{
    int w = dst.w;
    int h = dst.h;

    const T* ptr = src;
    T* outptr = dst;

    if (type == 0)
    {
        int y = 0;
        // fill top
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            outptr += w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = v;
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            outptr += w;
        }
    }
    else if (type == 1)
    {
        int y = 0;
        // fill top
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            outptr += w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        ptr -= src.w;
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            outptr += w;
        }
    }
    else if (type == 2)
    {
        int y = 0;
        // fill top
        ptr += top * src.w;
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            outptr += w;
            ptr -= src.w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        ptr -= 2 * src.w;
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            outptr += w;
            ptr -= src.w;
        }
    }

}